

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ssl_setup_x509_store(Curl_cfilter *cf,Curl_easy *data,SSL_CTX *ssl_ctx)

{
  int iVar1;
  ssl_primary_config *psVar2;
  ssl_config_data *psVar3;
  X509_STORE *pXVar4;
  bool bVar5;
  X509_STORE *store;
  _Bool cache_criteria_met;
  X509_STORE *cached_store;
  CURLcode result;
  ssl_config_data *ssl_config;
  ssl_primary_config *conn_config;
  SSL_CTX *ssl_ctx_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  psVar2 = Curl_ssl_cf_get_primary_config(cf);
  psVar3 = Curl_ssl_cf_get_config(cf,data);
  cached_store._4_4_ = CURLE_OK;
  bVar5 = false;
  if (((((data->set).general_ssl.ca_cache_timeout != 0) &&
       (bVar5 = false, (psVar2->field_0x79 & 1) != 0)) &&
      (bVar5 = false, psVar2->CApath == (char *)0x0)) &&
     ((bVar5 = false, psVar2->ca_info_blob == (curl_blob *)0x0 &&
      (bVar5 = false, (psVar3->primary).CRLfile == (char *)0x0)))) {
    bVar5 = ((byte)psVar3->field_0xc0 >> 6 & 1) == 0;
  }
  pXVar4 = (X509_STORE *)get_cached_x509_store(cf,data);
  if (((pXVar4 == (X509_STORE *)0x0) || (!bVar5)) || (iVar1 = X509_STORE_up_ref(pXVar4), iVar1 == 0)
     ) {
    pXVar4 = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
    cached_store._4_4_ = populate_x509_store(cf,data,(X509_STORE *)pXVar4);
    if ((cached_store._4_4_ == CURLE_OK) && (bVar5)) {
      set_cached_x509_store(cf,data,(X509_STORE *)pXVar4);
    }
  }
  else {
    SSL_CTX_set_cert_store((SSL_CTX *)ssl_ctx,pXVar4);
  }
  return cached_store._4_4_;
}

Assistant:

CURLcode Curl_ssl_setup_x509_store(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   SSL_CTX *ssl_ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  CURLcode result = CURLE_OK;
  X509_STORE *cached_store;
  bool cache_criteria_met;

  /* Consider the X509 store cacheable if it comes exclusively from a CAfile,
     or no source is provided and we are falling back to OpenSSL's built-in
     default. */
  cache_criteria_met = (data->set.general_ssl.ca_cache_timeout != 0) &&
    conn_config->verifypeer &&
    !conn_config->CApath &&
    !conn_config->ca_info_blob &&
    !ssl_config->primary.CRLfile &&
    !ssl_config->native_ca_store;

  cached_store = get_cached_x509_store(cf, data);
  if(cached_store && cache_criteria_met && X509_STORE_up_ref(cached_store)) {
    SSL_CTX_set_cert_store(ssl_ctx, cached_store);
  }
  else {
    X509_STORE *store = SSL_CTX_get_cert_store(ssl_ctx);

    result = populate_x509_store(cf, data, store);
    if(result == CURLE_OK && cache_criteria_met) {
      set_cached_x509_store(cf, data, store);
    }
  }

  return result;
}